

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeUnbind(Vdbe *p,int i)

{
  uint uVar1;
  sqlite3_mutex *psVar2;
  Mem *pMVar3;
  int iVar4;
  uint uVar5;
  
  iVar4 = vdbeSafetyNotNull(p);
  if (iVar4 == 0) {
    psVar2 = p->db->mutex;
    if (psVar2 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar2);
    }
    if (p->eVdbeState == '\x01') {
      if ((i < 1) || (p->nVar < i)) {
        iVar4 = 0x19;
        sqlite3Error(p->db,0x19);
        psVar2 = p->db->mutex;
        if (psVar2 != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(psVar2);
        }
      }
      else {
        uVar1 = i - 1;
        pMVar3 = p->aVar;
        sqlite3VdbeMemRelease(pMVar3 + uVar1);
        pMVar3[uVar1].flags = 1;
        p->db->errCode = 0;
        iVar4 = 0;
        if (p->expmask != 0) {
          uVar5 = 0x80000000;
          if ((uint)i < 0x20) {
            uVar5 = 1 << ((byte)uVar1 & 0x1f);
          }
          if ((p->expmask & uVar5) != 0) {
            p->field_0xc6 = (p->field_0xc6 & 0xfc) + 1;
          }
        }
      }
      return iVar4;
    }
    sqlite3Error(p->db,0x15);
    psVar2 = p->db->mutex;
    if (psVar2 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar2);
    }
    sqlite3_log(0x15,"bind on a busy prepared statement: [%s]",p->zSql);
    iVar4 = 0x15592;
  }
  else {
    iVar4 = 0x1558a;
  }
  iVar4 = sqlite3MisuseError(iVar4);
  return iVar4;
}

Assistant:

static int vdbeUnbind(Vdbe *p, int i){
  Mem *pVar;
  if( vdbeSafetyNotNull(p) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(p->db->mutex);
  if( p->eVdbeState!=VDBE_READY_STATE ){
    sqlite3Error(p->db, SQLITE_MISUSE);
    sqlite3_mutex_leave(p->db->mutex);
    sqlite3_log(SQLITE_MISUSE,
        "bind on a busy prepared statement: [%s]", p->zSql);
    return SQLITE_MISUSE_BKPT;
  }
  if( i<1 || i>p->nVar ){
    sqlite3Error(p->db, SQLITE_RANGE);
    sqlite3_mutex_leave(p->db->mutex);
    return SQLITE_RANGE;
  }
  i--;
  pVar = &p->aVar[i];
  sqlite3VdbeMemRelease(pVar);
  pVar->flags = MEM_Null;
  p->db->errCode = SQLITE_OK;

  /* If the bit corresponding to this variable in Vdbe.expmask is set, then
  ** binding a new value to this variable invalidates the current query plan.
  **
  ** IMPLEMENTATION-OF: R-57496-20354 If the specific value bound to a host
  ** parameter in the WHERE clause might influence the choice of query plan
  ** for a statement, then the statement will be automatically recompiled,
  ** as if there had been a schema change, on the first sqlite3_step() call
  ** following any change to the bindings of that parameter.
  */
  assert( (p->prepFlags & SQLITE_PREPARE_SAVESQL)!=0 || p->expmask==0 );
  if( p->expmask!=0 && (p->expmask & (i>=31 ? 0x80000000 : (u32)1<<i))!=0 ){
    p->expired = 1;
  }
  return SQLITE_OK;
}